

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_ls.c
# Opt level: O0

int arkLsMPSetup(void *arkode_mem)

{
  int iVar1;
  char *in_RDI;
  int retval;
  ARKLsMassMem arkls_mem;
  ARKodeMem ark_mem;
  ARKLsMassMem *in_stack_ffffffffffffffe0;
  ARKodeMem *in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  iVar1 = arkLs_AccessMassMem((void *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                              in_RDI,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
  if (iVar1 == 0) {
    if ((*(int *)(in_stack_ffffffffffffffe0 + 7) == 0) &&
       (in_stack_ffffffffffffffe0[0xe] != (ARKLsMassMem)0x0)) {
      iVar1 = 0;
    }
    else {
      iVar1 = (*(code *)in_stack_ffffffffffffffe0[0x15])
                        (in_stack_ffffffffffffffe8[0x33],in_stack_ffffffffffffffe0[0x18]);
      in_stack_ffffffffffffffe0[0xe] =
           (ARKLsMassMem)((long)&in_stack_ffffffffffffffe0[0xe]->iterative + 1);
    }
  }
  return iVar1;
}

Assistant:

int arkLsMPSetup(void *arkode_mem)
{
  ARKodeMem    ark_mem;
  ARKLsMassMem arkls_mem;
  int          retval;

  /* access ARKLsMassMem structure */
  retval = arkLs_AccessMassMem(arkode_mem, "arkLsMPSetup",
                               &ark_mem, &arkls_mem);
  if (retval != ARK_SUCCESS)  return(retval);

  /* only proceed if the mass matrix is time-independent or if
     pset has not been called previously */
  if (!arkls_mem->time_dependent && arkls_mem->npe)
    return(0);

  /* call user-supplied pset routine and increment counter */
  retval = arkls_mem->pset(ark_mem->tcur, arkls_mem->P_data);
  arkls_mem->npe++;
  return(retval);
}